

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::has_extended_member_decoration
          (Compiler *this,uint32_t type,uint32_t index,ExtendedDecorations decoration)

{
  Decoration *pDVar1;
  Meta *pMVar2;
  const_iterator cVar3;
  ulong uVar4;
  bool bVar5;
  key_type_conflict local_14;
  
  pMVar2 = ParsedIR::find_meta(&this->ir,(ID)type);
  if ((pMVar2 == (Meta *)0x0) ||
     (uVar4 = (ulong)index,
     (pMVar2->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size <= uVar4)) {
    bVar5 = false;
  }
  else {
    pDVar1 = (pMVar2->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr;
    if (decoration < 0x40) {
      bVar5 = (pDVar1[uVar4].extended.flags.lower >> ((ulong)decoration & 0x3f) & 1) != 0;
    }
    else {
      cVar3 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&pDVar1[uVar4].extended.flags.higher._M_h,&local_14);
      bVar5 = cVar3.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0;
    }
  }
  return bVar5;
}

Assistant:

bool Compiler::has_extended_member_decoration(uint32_t type, uint32_t index, ExtendedDecorations decoration) const
{
	auto *m = ir.find_meta(type);
	if (!m)
		return false;

	if (index >= m->members.size())
		return false;

	auto &dec = m->members[index];
	return dec.extended.flags.get(decoration);
}